

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O3

TidyOption tidyGetNextOption(TidyDoc tdoc,TidyIterator *pos)

{
  TidyIterator p_Var1;
  TidyOptionImpl *pTVar2;
  TidyOptionImpl *pTVar3;
  TidyDocImpl *impl;
  
  if (tdoc == (TidyDoc)0x0) {
    if (pos != (TidyIterator *)0x0) {
      *pos = (TidyIterator)0x0;
    }
    return (TidyOption)0x0;
  }
  if (pos != (TidyIterator *)0x0) {
    p_Var1 = *pos;
    pTVar2 = option_defs + (long)p_Var1;
    if (p_Var1 >= (TidyIterator)0x68 || p_Var1 == (TidyIterator)0x0) {
      pTVar2 = (TidyOptionImpl *)0x0;
    }
    pTVar3 = (TidyOptionImpl *)
             ((long)&p_Var1->_opaque +
             (ulong)(p_Var1 < (TidyIterator)0x68 && p_Var1 != (TidyIterator)0x0));
    if ((TidyOptionImpl *)0x67 < pTVar3) {
      pTVar3 = (TidyOptionImpl *)0x0;
    }
    *pos = (TidyIterator)pTVar3;
    return (TidyOption)pTVar2;
  }
  __assert_fail("iter != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/config.c",
                0x709,"const TidyOptionImpl *prvTidygetNextOption(TidyDocImpl *, TidyIterator *)");
}

Assistant:

TidyOption TIDY_CALL    tidyGetNextOption( TidyDoc tdoc, TidyIterator* pos )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    const TidyOptionImpl* option = NULL;
    if ( impl )
        option = TY_(getNextOption)( impl, pos );
    else if ( pos )
        *pos = 0;
    return tidyImplToOption( option );
}